

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_prev(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    iVar1 = jx9_value_is_json_array(*apArg);
    if (iVar1 == 0) {
      jx9_result_bool(pCtx,0);
    }
    else {
      HashmapCurrentValue(pCtx,(jx9_hashmap *)((*apArg)->x).pOther,-1);
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_prev(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	HashmapCurrentValue(&(*pCtx), (jx9_hashmap *)apArg[0]->x.pOther, -1);
	return JX9_OK;
}